

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseCommandSequence(Parser *this,char indicator,initializer_list<const_char_*> terminators)

{
  TokenType TVar1;
  Tokenizer *pTVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  Token *this_00;
  Identifier *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar6;
  undefined7 in_register_00000031;
  Parser *this_01;
  size_type in_R8;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_80;
  undefined1 local_78 [16];
  string expected;
  initializer_list<const_char_*> terminators_local;
  
  this_01 = (Parser *)CONCAT71(in_register_00000031,indicator);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)terminators._M_len;
  terminators_local._M_array = (iterator)args;
  terminators_local._M_len = in_R8;
  std::make_unique<CommandSequence>();
LAB_0013f4a0:
  pTVar2 = (this_01->entries).
           super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].tokenizer;
  if (*(Tokenizer **)&pTVar2->position == pTVar2) {
    if (terminators_local._M_len != 0) {
      expected._M_dataplus._M_p = (pointer)&expected.field_2;
      expected._M_string_length = 0;
      expected.field_2._M_local_buf[0] = '\0';
      for (lVar6 = 0; terminators_local._M_len << 3 != lVar6; lVar6 = lVar6 + 8) {
        if (expected._M_string_length != 0) {
          std::__cxx11::string::append((char *)&expected);
        }
        std::__cxx11::string::append((char *)&expected);
      }
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x177c91,(char *)&expected,args);
      std::__cxx11::string::~string((string *)&expected);
    }
LAB_0013f651:
    (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_78._8_8_;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           this;
  }
  this_00 = peekToken(this_01,0);
  TVar1 = this_00->type;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)TVar1;
  if (TVar1 == Identifier) {
    value = Token::identifierValue(this_00);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (value->_name)._M_dataplus._M_p;
    if (*(char *)&(args->_M_dataplus)._M_p == (char)terminators._M_array) {
      bVar4 = isPartOfList(value,&terminators_local);
      if (bVar4) goto LAB_0013f651;
    }
  }
  else if (TVar1 == Separator) {
    eatToken(this_01);
    goto LAB_0013f4a0;
  }
  bVar4 = false;
LAB_0013f4fb:
  bVar5 = checkEquLabel(this_01);
  if (!bVar5) {
    bVar5 = checkMacroDefinition(this_01);
    if (!bVar5) {
      bVar5 = checkExpFuncDefinition(this_01);
      if (!bVar5) goto LAB_0013f560;
    }
  }
  uVar3 = local_78._8_8_;
  bVar4 = true;
  if (this_01->error == true) {
    handleError((Parser *)local_78);
    std::
    vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
    ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
              ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
                *)(uVar3 + 0x18),
               (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)local_78);
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      (*(code *)((*(Tokenizer **)local_78._0_8_)->tokens).
                super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
                super__List_node_base._M_prev)();
    }
    local_78._0_8_ = (pointer)0x0;
  }
  goto LAB_0013f4fb;
LAB_0013f560:
  if (!bVar4) {
    parseCommand((Parser *)&expected);
    if ((this_01->conditionStack).
        super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].inTrueBlock == false) {
      if (expected._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)expected._M_dataplus._M_p + 8))();
      }
    }
    else {
      local_80._M_head_impl = (CAssemblerCommand *)expected._M_dataplus._M_p;
      std::
      vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
      ::emplace_back<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>
                ((vector<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>,std::allocator<std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>>>
                  *)(local_78._8_8_ + 0x18),
                 (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)&local_80
                );
      if (local_80._M_head_impl != (CAssemblerCommand *)0x0) {
        (*(local_80._M_head_impl)->_vptr_CAssemblerCommand[1])();
      }
      local_80._M_head_impl = (CAssemblerCommand *)0x0;
    }
  }
  goto LAB_0013f4a0;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseCommandSequence(char indicator, const std::initializer_list<const char*> terminators)
{
	auto sequence = std::make_unique<CommandSequence>();

	bool foundTermination = false;
	while (!atEnd())
	{
		const Token &next = peekToken();

		if(next.type == TokenType::Separator)
		{
			eatToken();
			continue;
		}

		if (next.type == TokenType::Identifier)
		{
			const auto &identifier = next.identifierValue();
			if (identifier.startsWith(indicator) && isPartOfList(identifier, terminators))
			{
				foundTermination = true;
				break;
			}
		}

		bool foundSomething = false;
		while (checkEquLabel() || checkMacroDefinition() || checkExpFuncDefinition())
		{
			// do nothing, just parse all the equs and macros there are
			if (hasError())
				sequence->addCommand(handleError());

			foundSomething = true;
		}

		if (foundSomething)
			continue;

		std::unique_ptr<CAssemblerCommand> cmd = parseCommand();

		// omit commands inside blocks that are trivially false
		if (!isInsideTrueBlock())
		{
			continue;
		}

		sequence->addCommand(std::move(cmd));
	}

	if (!foundTermination && terminators.size())
	{
		std::string expected;
		for (const char* terminator : terminators)
		{
			if (!expected.empty())
				expected += ", ";
			expected += terminator;
		}

		Logger::printError(Logger::Error, "Unterminated command sequence, expected any of %s.", expected);
	}

	return sequence;
}